

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_hex(basic_substring<const_char> *this,size_t pos)

{
  char *pcVar1;
  char cVar2;
  basic_substring<const_char> bVar3;
  basic_substring<const_char> *pbVar4;
  error_flags eVar5;
  ulong uVar6;
  ulong in_RSI;
  long *in_RDI;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char c_2;
  char c_1;
  char c;
  bool powchars;
  bool fracchars;
  bool intchars;
  size_t in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  basic_substring<const_char> *in_stack_fffffffffffffbc0;
  bool local_347;
  bool local_29a;
  basic_substring<const_char> *local_238;
  char *local_228;
  size_t local_220;
  char *local_1f8;
  size_t local_1f0;
  char *local_1c8;
  size_t local_1c0;
  char *local_198;
  size_t local_190;
  char *local_168;
  size_t local_160;
  char *local_138;
  size_t local_130;
  char *local_108;
  size_t local_100;
  char *local_d8;
  size_t local_d0;
  char *local_a8;
  size_t local_a0;
  char *local_78;
  size_t local_70;
  char *local_48;
  size_t local_40;
  char *local_18;
  size_t local_10;
  
  bVar9 = false;
  bVar7 = false;
  for (local_238 = (basic_substring<const_char> *)in_RSI; local_238 < (ulong)in_RDI[1];
      local_238 = (basic_substring<const_char> *)((long)local_238 + 1)) {
    cVar2 = *(char *)(*in_RDI + (long)local_238);
    if (((cVar2 < '0') || (local_29a = true, '9' < cVar2)) &&
       ((cVar2 < 'a' || (local_29a = true, 'f' < cVar2)))) {
      local_29a = '@' < cVar2 && cVar2 < 'G';
    }
    if (!local_29a) {
      if (cVar2 == '.') {
        uVar6 = (long)local_238 + 1;
        if (uVar6 == 0) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            trap_instruction();
          }
          handle_error(0x3f0daf,(char *)0x193f,"check failed: %s","pos > 0");
        }
        pcVar1 = (char *)(*in_RDI + (long)local_238);
        local_238 = (basic_substring<const_char> *)uVar6;
        if (*pcVar1 != '.') {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            trap_instruction();
          }
          handle_error(0x3f0daf,(char *)0x1940,"check failed: %s","str[pos - 1] == \'.\'");
        }
        goto LAB_00327b69;
      }
      pbVar4 = local_238;
      if ((cVar2 == 'p') || (cVar2 == 'P')) goto LAB_003283d6;
      bVar7 = true;
      if ((((cVar2 != ' ') && (bVar7 = true, cVar2 != '\n')) && (bVar7 = true, cVar2 != ']')) &&
         ((((bVar7 = true, cVar2 != ')' && (bVar7 = true, cVar2 != '}')) &&
           ((bVar7 = true, cVar2 != ',' &&
            ((bVar7 = true, cVar2 != ';' && (bVar7 = true, cVar2 != '\r')))))) &&
          (bVar7 = true, cVar2 != '\t')))) {
        bVar7 = cVar2 == '\0';
      }
      if (bVar7) {
        if (bVar9) {
          if ((ulong)in_RDI[1] < local_238 &&
              local_238 != (basic_substring<const_char> *)0xffffffffffffffff) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              trap_instruction();
            }
            handle_error(0x3f0daf,(char *)0x154e,"check failed: %s","num <= len || num == npos");
          }
          basic_substring(in_stack_fffffffffffffbc0,
                          (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                          in_stack_fffffffffffffbb0);
          local_228 = local_18;
          local_220 = local_10;
        }
        else {
          basic_substring(in_stack_fffffffffffffbc0,
                          (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                          in_stack_fffffffffffffbb0);
          local_228 = local_48;
          local_220 = local_40;
        }
      }
      else {
        basic_substring(in_stack_fffffffffffffbc0,
                        (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                        in_stack_fffffffffffffbb0);
        local_228 = local_78;
        local_220 = local_70;
      }
      goto LAB_00328b37;
    }
    bVar9 = true;
  }
  if (bVar9) {
    local_228 = (char *)*in_RDI;
    local_220 = in_RDI[1];
  }
  else {
    basic_substring(in_stack_fffffffffffffbc0,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    in_stack_fffffffffffffbb0);
    local_228 = local_a8;
    local_220 = local_a0;
  }
  goto LAB_00328b37;
LAB_00327b69:
  if ((ulong)in_RDI[1] <= local_238) goto LAB_00328225;
  cVar2 = *(char *)(*in_RDI + (long)local_238);
  if (((cVar2 < '0') || (local_347 = true, '9' < cVar2)) &&
     ((cVar2 < 'a' || (local_347 = true, 'f' < cVar2)))) {
    local_347 = '@' < cVar2 && cVar2 < 'G';
  }
  if (!local_347) {
    pbVar4 = local_238;
    if ((cVar2 == 'p') || (cVar2 == 'P')) goto LAB_003283d6;
    bVar8 = true;
    if (((cVar2 != ' ') &&
        (((((bVar8 = true, cVar2 != '\n' && (bVar8 = true, cVar2 != ']')) &&
           (bVar8 = true, cVar2 != ')')) &&
          ((bVar8 = true, cVar2 != '}' && (bVar8 = true, cVar2 != ',')))) &&
         (bVar8 = true, cVar2 != ';')))) &&
       ((bVar8 = true, cVar2 != '\r' && (bVar8 = true, cVar2 != '\t')))) {
      bVar8 = cVar2 == '\0';
    }
    if (bVar8) {
      if ((bVar9) || (bVar7)) {
        if ((ulong)in_RDI[1] < local_238 &&
            local_238 != (basic_substring<const_char> *)0xffffffffffffffff) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            trap_instruction();
          }
          handle_error(0x3f0daf,(char *)0x154e,"check failed: %s","num <= len || num == npos");
        }
        basic_substring(in_stack_fffffffffffffbc0,
                        (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                        in_stack_fffffffffffffbb0);
        local_228 = local_d8;
        local_220 = local_d0;
      }
      else {
        basic_substring(in_stack_fffffffffffffbc0,
                        (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                        in_stack_fffffffffffffbb0);
        local_228 = local_108;
        local_220 = local_100;
      }
    }
    else {
      basic_substring(in_stack_fffffffffffffbc0,
                      (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                      in_stack_fffffffffffffbb0);
      local_228 = local_138;
      local_220 = local_130;
    }
    goto LAB_00328b37;
  }
  bVar7 = true;
  local_238 = (basic_substring<const_char> *)((long)local_238 + 1);
  goto LAB_00327b69;
LAB_00328225:
  if ((bVar9) || (bVar7)) {
    local_228 = (char *)*in_RDI;
    local_220 = in_RDI[1];
  }
  else {
    basic_substring(in_stack_fffffffffffffbc0,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    in_stack_fffffffffffffbb0);
    local_228 = local_168;
    local_220 = local_160;
  }
  goto LAB_00328b37;
LAB_003283d6:
  local_238 = (basic_substring<const_char> *)((long)pbVar4 + 1);
  if (local_238 == (basic_substring<const_char> *)0x0) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      trap_instruction();
    }
    handle_error(0x3f0daf,(char *)0x195a,"check failed: %s","pos > 0");
  }
  bVar8 = true;
  if (*(char *)(*in_RDI + (long)pbVar4) != 'p') {
    bVar8 = *(char *)(*in_RDI + (long)pbVar4) == 'P';
  }
  if (!bVar8) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      trap_instruction();
    }
    handle_error(0x3f0daf,(char *)0x195b,"check failed: %s",
                 "str[pos - 1] == \'p\' || str[pos - 1] == \'P\'");
  }
  if ((((long)pbVar4 + 2U < (ulong)in_RDI[1]) &&
      ((*(char *)(*in_RDI + (long)local_238) == '+' || (*(char *)(*in_RDI + (long)local_238) == '-')
       ))) && ((bVar9 || (bVar7)))) {
    bVar9 = false;
    for (local_238 = (basic_substring<const_char> *)((long)pbVar4 + 2);
        local_238 < (basic_substring<const_char> *)in_RDI[1];
        local_238 = (basic_substring<const_char> *)((long)&local_238->str + 1)) {
      cVar2 = *(char *)((long)&local_238->str + *in_RDI);
      if ((cVar2 < '0') || ('9' < cVar2)) {
        if (bVar9) {
          bVar9 = true;
          if (((((cVar2 != ' ') && (bVar9 = true, cVar2 != '\n')) && (bVar9 = true, cVar2 != ']'))
              && (((bVar9 = true, cVar2 != ')' && (bVar9 = true, cVar2 != '}')) &&
                  ((bVar9 = true, cVar2 != ',' &&
                   ((bVar9 = true, cVar2 != ';' && (bVar9 = true, cVar2 != '\r')))))))) &&
             (bVar9 = true, cVar2 != '\t')) {
            bVar9 = cVar2 == '\0';
          }
          if (bVar9) {
            if ((basic_substring<const_char> *)in_RDI[1] < local_238 &&
                local_238 != (basic_substring<const_char> *)0xffffffffffffffff) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                trap_instruction();
              }
              handle_error(0x3f0daf,(char *)0x154e,"check failed: %s","num <= len || num == npos");
            }
            if (local_238 == (basic_substring<const_char> *)0xffffffffffffffff) {
              local_238 = (basic_substring<const_char> *)in_RDI[1];
            }
            basic_substring(local_238,
                            (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            in_stack_fffffffffffffbb0);
            local_228 = local_1c8;
            local_220 = local_1c0;
            goto LAB_00328b37;
          }
        }
        basic_substring(in_stack_fffffffffffffbc0,(char *)CONCAT17(1,in_stack_fffffffffffffbb8),
                        (size_t)in_RDI);
        local_228 = local_1f8;
        local_220 = local_1f0;
        goto LAB_00328b37;
      }
      bVar9 = true;
    }
    local_228 = (char *)*in_RDI;
    local_220 = in_RDI[1];
  }
  else {
    basic_substring(in_stack_fffffffffffffbc0,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    in_stack_fffffffffffffbb0);
    local_228 = local_198;
    local_220 = local_190;
  }
LAB_00328b37:
  bVar3.len = local_220;
  bVar3.str = local_228;
  return bVar3;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_hex(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(_is_hex_char(c))
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_hex;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_hex;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_hex:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(_is_hex_char(c))
            {
                fracchars = true;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_hex;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_hex:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'p' || str[pos - 1] == 'P');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || (str[pos] != '+' && str[pos] != '-') || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }